

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O1

QRegion __thiscall QRegion::intersected(QRegion *this,QRect *r)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  QRect *in_RDX;
  ulong uVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  undefined1 auVar11 [16];
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  piVar5 = *(int **)(*(long *)r + 8);
  if ((piVar5 != (int *)0x0) && (*piVar5 != 0)) {
    iVar1 = (in_RDX->x1).m_i;
    iVar2 = (in_RDX->y1).m_i;
    iVar3 = (in_RDX->x2).m_i;
    iVar4 = (in_RDX->y2).m_i;
    if ((iVar2 <= iVar4 && iVar1 <= iVar3) &&
       ((((iVar1 <= piVar5[10] && (piVar5[8] <= iVar3)) && (iVar2 <= piVar5[0xb])) &&
        (piVar5[9] <= iVar4)))) {
      if ((((piVar5[8] < iVar1) || (iVar3 < piVar5[10])) || (piVar5[9] < iVar2)) ||
         (iVar4 < piVar5[0xb])) {
        if (((iVar1 < piVar5[0xc]) || (piVar5[0xe] < iVar3)) ||
           ((iVar2 < piVar5[0xd] || (piVar5[0xf] < iVar4)))) {
          if (*piVar5 == 1) {
            local_38 = &DAT_aaaaaaaaaaaaaaaa;
            puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
            lVar6 = *(long *)(*(long *)r + 8);
            auVar11 = QRect::normalized();
            uVar8 = (ulong)*(uint *)(lVar6 + 0x20);
            if ((int)*(uint *)(lVar6 + 0x20) <= auVar11._0_4_) {
              uVar8 = auVar11._0_8_ & 0xffffffff;
            }
            uVar10 = (ulong)*(uint *)(lVar6 + 0x28);
            if (auVar11._8_4_ <= (int)*(uint *)(lVar6 + 0x28)) {
              uVar10 = auVar11._8_8_ & 0xffffffff;
            }
            uVar7 = auVar11._0_8_ >> 0x20;
            if (auVar11._4_4_ < (int)*(uint *)(lVar6 + 0x24)) {
              uVar7 = (ulong)*(uint *)(lVar6 + 0x24);
            }
            uVar9 = auVar11._8_8_ >> 0x20;
            if ((int)*(uint *)(lVar6 + 0x2c) < auVar11._12_4_) {
              uVar9 = (ulong)*(uint *)(lVar6 + 0x2c);
            }
            local_38 = (undefined1 *)(uVar8 | uVar7 << 0x20);
            puStack_30 = (undefined1 *)(uVar10 | uVar9 << 0x20);
            QRegion(this,(QRect *)&local_38,Rectangle);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
              return (QRegion)(QRegionData *)this;
            }
          }
          else {
            this->d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
            QRegion(this,(QRegion *)r);
            detach(this);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
              QRegionPrivate::intersect(this->d->qt_rgn,in_RDX);
              return (QRegion)(QRegionData *)this;
            }
          }
        }
        else if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          QRegion(this,in_RDX,Rectangle);
          return (QRegion)(QRegionData *)this;
        }
      }
      else if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        QRegion(this,(QRegion *)r);
        return (QRegion)(QRegionData *)this;
      }
      goto LAB_004318d6;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    QRegion(this);
    return (QRegion)(QRegionData *)this;
  }
LAB_004318d6:
  __stack_chk_fail();
}

Assistant:

QRegion QRegion::intersected(const QRect &r) const
{
    if (isEmptyHelper(d->qt_rgn) || r.isEmpty()
        || !EXTENTCHECK(&d->qt_rgn->extents, &r))
        return QRegion();

    /* this is fully contained in r */
    if (d->qt_rgn->within(r))
        return *this;

    /* r is fully contained in this */
    if (d->qt_rgn->contains(r))
        return r;

    if (d->qt_rgn->numRects == 1) {
        const QRect rect = qt_rect_intersect_normalized(d->qt_rgn->extents,
                                                        r.normalized());
        return QRegion(rect);
    }

    QRegion result(*this);
    result.detach();
    result.d->qt_rgn->intersect(r);
    return result;
}